

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# synthesis.c
# Opt level: O3

int vorbis_synthesis_trackonly(vorbis_block *vb,ogg_packet *op)

{
  oggpack_buffer *b;
  void *pvVar1;
  void *pvVar2;
  int *piVar3;
  ogg_int64_t oVar4;
  int iVar5;
  long lVar6;
  int iVar7;
  
  pvVar1 = vb->vd->backend_state;
  pvVar2 = vb->vd->vi->codec_setup;
  b = &vb->opb;
  _vorbis_block_ripcord(vb);
  oggpack_readinit(b,op->packet,(int)op->bytes);
  lVar6 = oggpack_read(b,1);
  iVar7 = -0x87;
  if (lVar6 == 0) {
    lVar6 = oggpack_read(b,*(int *)((long)pvVar1 + 0x50));
    iVar7 = -0x88;
    iVar5 = (int)lVar6;
    if (iVar5 != -1) {
      vb->mode = iVar5;
      piVar3 = *(int **)((long)pvVar2 + (long)iVar5 * 8 + 0x28);
      if (piVar3 != (int *)0x0) {
        lVar6 = (long)*piVar3;
        vb->W = lVar6;
        if (lVar6 == 0) {
          vb->lW = 0;
          vb->nW = 0;
        }
        else {
          lVar6 = oggpack_read(b,1);
          vb->lW = lVar6;
          lVar6 = oggpack_read(b,1);
          vb->nW = lVar6;
          if (lVar6 == -1) {
            return -0x88;
          }
        }
        oVar4 = op->packetno;
        vb->granulepos = op->granulepos;
        vb->sequence = oVar4;
        vb->eofflag = (int)op->e_o_s;
        vb->pcmend = 0;
        vb->pcm = (float **)0x0;
        iVar7 = 0;
      }
    }
  }
  return iVar7;
}

Assistant:

int vorbis_synthesis_trackonly(vorbis_block *vb,ogg_packet *op){
  vorbis_dsp_state     *vd=vb->vd;
  private_state        *b=vd->backend_state;
  vorbis_info          *vi=vd->vi;
  codec_setup_info     *ci=vi->codec_setup;
  oggpack_buffer       *opb=&vb->opb;
  int                   mode;

  /* first things first.  Make sure decode is ready */
  _vorbis_block_ripcord(vb);
  oggpack_readinit(opb,op->packet,op->bytes);

  /* Check the packet type */
  if(oggpack_read(opb,1)!=0){
    /* Oops.  This is not an audio data packet */
    return(OV_ENOTAUDIO);
  }

  /* read our mode and pre/post windowsize */
  mode=oggpack_read(opb,b->modebits);
  if(mode==-1)return(OV_EBADPACKET);

  vb->mode=mode;
  if(!ci->mode_param[mode]){
    return(OV_EBADPACKET);
  }

  vb->W=ci->mode_param[mode]->blockflag;
  if(vb->W){
    vb->lW=oggpack_read(opb,1);
    vb->nW=oggpack_read(opb,1);
    if(vb->nW==-1)   return(OV_EBADPACKET);
  }else{
    vb->lW=0;
    vb->nW=0;
  }

  /* more setup */
  vb->granulepos=op->granulepos;
  vb->sequence=op->packetno;
  vb->eofflag=op->e_o_s;

  /* no pcm */
  vb->pcmend=0;
  vb->pcm=NULL;

  return(0);
}